

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pe_crypto.cpp
# Opt level: O0

array<char,_96UL> * libtorrent::aux::export_key(array<char,_96UL> *__return_storage_ptr__,key_t *k)

{
  int v;
  uchar *out;
  uchar *puVar1;
  unsigned_long uVar2;
  int len;
  uint8_t *end;
  uint8_t *begin;
  key_t *k_local;
  
  out = (uchar *)::std::array<char,_96UL>::data(__return_storage_ptr__);
  puVar1 = boost::multiprecision::
           export_bits<768u,768u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void,(boost::multiprecision::expression_template_option)0,unsigned_char*>
                     (k,out,8,true);
  if (puVar1 < out + 0x60) {
    v = (int)puVar1 - (int)out;
    uVar2 = numeric_cast<unsigned_long,int,void>(v);
    memmove(out + (0x60 - (long)v),out,uVar2);
    uVar2 = numeric_cast<unsigned_long,int,void>(0x60 - v);
    memset(out,0,uVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::array<char, 96> export_key(key_t const& k)
	{
		std::array<char, 96> ret;
		auto* begin = reinterpret_cast<std::uint8_t*>(ret.data());
		std::uint8_t* end = mp::export_bits(k, begin, 8);

		// TODO: it would be nice to be able to export to a fixed width field, so
		// we wouldn't have to shift it later
		if (end < begin + 96)
		{
			int const len = int(end - begin);
#if defined __GNUC__ && __GNUC__ == 12
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wstringop-overflow"
#endif
			std::memmove(begin + 96 - len, begin, aux::numeric_cast<std::size_t>(len));
#if defined __GNUC__ && __GNUC__ == 12
#pragma GCC diagnostic pop
#endif
			std::memset(begin, 0, aux::numeric_cast<std::size_t>(96 - len));
		}
		return ret;
	}